

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraEclipseCDT4Generator.cxx
# Opt level: O0

void __thiscall
cmExtraEclipseCDT4Generator::CreateSourceProjectFile(cmExtraEclipseCDT4Generator *this)

{
  bool bVar1;
  byte bVar2;
  LocalGeneratorVector *this_00;
  pointer this_01;
  allocator<char> local_4a9;
  string local_4a8;
  allocator<char> local_481;
  string local_480;
  allocator<char> local_459;
  string local_458;
  allocator<char> local_431;
  string local_430;
  allocator<char> local_409;
  string local_408;
  allocator<char> local_3e1;
  string local_3e0;
  allocator<char> local_3b9;
  string local_3b8;
  undefined1 local_398 [8];
  cmXMLWriter xml;
  undefined1 local_338 [8];
  cmGeneratedFileStream fout;
  string filename;
  allocator<char> local_79;
  string local_78;
  string local_58;
  undefined1 local_38 [8];
  string name;
  value_type *lg;
  cmExtraEclipseCDT4Generator *this_local;
  
  bVar1 = std::operator!=(&this->HomeDirectory,&this->HomeOutputDirectory);
  if (!bVar1) {
    __assert_fail("this->HomeDirectory != this->HomeOutputDirectory",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmExtraEclipseCDT4Generator.cxx"
                  ,200,"void cmExtraEclipseCDT4Generator::CreateSourceProjectFile()");
  }
  this_00 = cmGlobalGenerator::GetLocalGenerators
                      ((this->super_cmExternalMakefileProjectGenerator).GlobalGenerator);
  name.field_2._8_8_ =
       std::
       vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
       ::operator[](this_00,0);
  this_01 = std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>::operator->
                      ((unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_> *)
                       name.field_2._8_8_);
  cmLocalGenerator::GetProjectName_abi_cxx11_(&local_58,this_01);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"Source",&local_79);
  GetPathBasename((string *)((long)&filename.field_2 + 8),&this->HomeDirectory);
  GenerateProjectName((string *)local_38,&local_58,&local_78,(string *)((long)&filename.field_2 + 8)
                     );
  std::__cxx11::string::~string((string *)(filename.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator(&local_79);
  std::__cxx11::string::~string((string *)&local_58);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &fout.field_0x260,&this->HomeDirectory,"/.project");
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)local_338,(string *)&fout.field_0x260,false,None);
  bVar2 = std::ios::operator!((ios *)(local_338 + (long)*(_func_int **)((long)local_338 + -0x18)));
  if ((bVar2 & 1) == 0) {
    cmXMLWriter::cmXMLWriter((cmXMLWriter *)local_398,(ostream *)local_338,0);
    cmXMLWriter::StartDocument((cmXMLWriter *)local_398,"UTF-8");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3b8,"projectDescription",&local_3b9);
    cmXMLWriter::StartElement((cmXMLWriter *)local_398,&local_3b8);
    std::__cxx11::string::~string((string *)&local_3b8);
    std::allocator<char>::~allocator(&local_3b9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_3e0,"name",&local_3e1);
    cmXMLWriter::Element<std::__cxx11::string>
              ((cmXMLWriter *)local_398,&local_3e0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
    std::__cxx11::string::~string((string *)&local_3e0);
    std::allocator<char>::~allocator(&local_3e1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_408,"comment",&local_409);
    cmXMLWriter::Element<char[1]>((cmXMLWriter *)local_398,&local_408,(char (*) [1])0xcbf1b7);
    std::__cxx11::string::~string((string *)&local_408);
    std::allocator<char>::~allocator(&local_409);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_430,"projects",&local_431);
    cmXMLWriter::Element<char[1]>((cmXMLWriter *)local_398,&local_430,(char (*) [1])0xcbf1b7);
    std::__cxx11::string::~string((string *)&local_430);
    std::allocator<char>::~allocator(&local_431);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_458,"buildSpec",&local_459);
    cmXMLWriter::Element<char[1]>((cmXMLWriter *)local_398,&local_458,(char (*) [1])0xcbf1b7);
    std::__cxx11::string::~string((string *)&local_458);
    std::allocator<char>::~allocator(&local_459);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_480,"natures",&local_481);
    cmXMLWriter::Element<char[1]>((cmXMLWriter *)local_398,&local_480,(char (*) [1])0xcbf1b7);
    std::__cxx11::string::~string((string *)&local_480);
    std::allocator<char>::~allocator(&local_481);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_4a8,"linkedResources",&local_4a9);
    cmXMLWriter::StartElement((cmXMLWriter *)local_398,&local_4a8);
    std::__cxx11::string::~string((string *)&local_4a8);
    std::allocator<char>::~allocator(&local_4a9);
    if ((this->SupportsVirtualFolders & 1U) != 0) {
      CreateLinksToSubprojects(this,(cmXMLWriter *)local_398,&this->HomeDirectory);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear(&this->SrcLinkedResources);
    }
    cmXMLWriter::EndElement((cmXMLWriter *)local_398);
    cmXMLWriter::EndElement((cmXMLWriter *)local_398);
    cmXMLWriter::EndDocument((cmXMLWriter *)local_398);
    cmXMLWriter::~cmXMLWriter((cmXMLWriter *)local_398);
    xml._84_4_ = 0;
  }
  else {
    xml._84_4_ = 1;
  }
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_338);
  std::__cxx11::string::~string((string *)&fout.field_0x260);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void cmExtraEclipseCDT4Generator::CreateSourceProjectFile()
{
  assert(this->HomeDirectory != this->HomeOutputDirectory);

  // set up the project name: <project>-Source@<baseSourcePathName>
  const auto& lg = this->GlobalGenerator->GetLocalGenerators()[0];
  std::string name = cmExtraEclipseCDT4Generator::GenerateProjectName(
    lg->GetProjectName(), "Source",
    cmExtraEclipseCDT4Generator::GetPathBasename(this->HomeDirectory));

  const std::string filename = this->HomeDirectory + "/.project";
  cmGeneratedFileStream fout(filename);
  if (!fout) {
    return;
  }

  cmXMLWriter xml(fout);
  xml.StartDocument("UTF-8");
  xml.StartElement("projectDescription");
  xml.Element("name", name);
  xml.Element("comment", "");
  xml.Element("projects", "");
  xml.Element("buildSpec", "");
  xml.Element("natures", "");
  xml.StartElement("linkedResources");

  if (this->SupportsVirtualFolders) {
    this->CreateLinksToSubprojects(xml, this->HomeDirectory);
    this->SrcLinkedResources.clear();
  }

  xml.EndElement(); // linkedResources
  xml.EndElement(); // projectDescription
  xml.EndDocument();
}